

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O3

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::TemporaryFileManager::ReadTemporaryBuffer
          (TemporaryFileManager *this,block_id_t id,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer)

{
  TemporaryFileIndex index_00;
  optional_ptr<duckdb::TemporaryFileHandle,_true> block_index;
  mapped_type *pmVar1;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *reusable_buffer_00;
  undefined8 *in_RCX;
  pointer *__ptr;
  TemporaryFileManagerLock lock_1;
  TemporaryFileManagerLock lock;
  TemporaryFileIndex index;
  TemporaryFileManagerLock local_68;
  long *local_60;
  TemporaryFileManagerLock local_58;
  optional_ptr<duckdb::TemporaryFileHandle,_true> local_50;
  TemporaryFileIndex local_48;
  
  TemporaryFileIndex::TemporaryFileIndex(&local_48);
  TemporaryFileManagerLock::TemporaryFileManagerLock(&local_58,(mutex *)(id + 0x28));
  local_68.lock._M_device = (lock_guard<std::mutex>)(lock_guard<std::mutex>)reusable_buffer;
  pmVar1 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(id + 0x90),(key_type *)&local_68);
  local_48.identifier.size = (pmVar1->identifier).size;
  local_48.identifier.file_index.index = (pmVar1->identifier).file_index.index;
  local_48.block_index.index = (pmVar1->block_index).index;
  local_50 = TemporaryFileMap::GetFile((TemporaryFileMap *)(id + 0x50),&local_48.identifier);
  pthread_mutex_unlock((pthread_mutex_t *)local_58.lock._M_device);
  optional_ptr<duckdb::TemporaryFileHandle,_true>::CheckValid(&local_50);
  block_index.ptr = local_50.ptr;
  reusable_buffer_00 =
       (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
       optional_idx::GetIndex(&local_48.block_index);
  local_60 = (long *)*in_RCX;
  *in_RCX = 0;
  TemporaryFileHandle::ReadTemporaryBuffer
            ((TemporaryFileHandle *)this,(idx_t)block_index.ptr,reusable_buffer_00);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 8))();
  }
  local_60 = (long *)0x0;
  TemporaryFileManagerLock::TemporaryFileManagerLock(&local_68,(mutex *)(id + 0x28));
  optional_ptr<duckdb::TemporaryFileHandle,_true>::CheckValid(&local_50);
  index_00.identifier.file_index.index = local_48.identifier.file_index.index;
  index_00.identifier.size = local_48.identifier.size;
  index_00.block_index.index = local_48.block_index.index;
  EraseUsedBlock((TemporaryFileManager *)id,&local_68,(block_id_t)reusable_buffer,local_50.ptr,
                 index_00);
  pthread_mutex_unlock((pthread_mutex_t *)local_68.lock._M_device);
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> TemporaryFileManager::ReadTemporaryBuffer(block_id_t id,
                                                                 unique_ptr<FileBuffer> reusable_buffer) {
	TemporaryFileIndex index;
	optional_ptr<TemporaryFileHandle> handle;
	{
		TemporaryFileManagerLock lock(manager_lock);
		index = GetTempBlockIndex(lock, id);
		handle = GetFileHandle(lock, index.identifier);
	}

	auto buffer = handle->ReadTemporaryBuffer(index.block_index.GetIndex(), std::move(reusable_buffer));
	{
		// remove the block (and potentially erase the temp file)
		TemporaryFileManagerLock lock(manager_lock);
		EraseUsedBlock(lock, id, *handle, index);
	}
	return buffer;
}